

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error
astcenc_context_alloc(astcenc_config *configp,uint thread_count,astcenc_context **context)

{
  condition_variable *this;
  condition_variable *this_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  astcenc_profile aVar5;
  float fVar6;
  astcenc_progress_callback p_Var7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined4 uVar32;
  astcenc_error aVar33;
  uint uVar34;
  int iVar35;
  astcenc_context *this_01;
  compression_working_buffers *pcVar36;
  uint uVar37;
  astcenc_error aVar38;
  block_size_descriptor *bsd;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float xprec_testval;
  undefined4 local_48;
  undefined4 uStack_44;
  astcenc_context **local_40;
  condition_variable *local_38;
  
  local_48 = 0x4020a3d7;
  if (thread_count == 0) {
    return ASTCENC_ERR_BAD_PARAM;
  }
  local_40 = context;
  this_01 = (astcenc_context *)operator_new(0x2e8);
  (this_01->manage_avg).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->manage_avg).m_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this_01->manage_avg).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this_01->manage_avg).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->manage_avg).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_38 = &(this_01->manage_avg).m_complete;
  std::condition_variable::condition_variable(local_38);
  (this_01->manage_avg).m_callback_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this_01->manage_avg).m_callback_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->manage_avg).m_callback_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this_01->manage_avg).m_callback_lock.super___mutex_base._M_mutex + 0x10) =
       0;
  (this_01->manage_avg).m_callback_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->manage_avg).m_init_done = false;
  (this_01->manage_avg).m_term_done = false;
  LOCK();
  (this_01->manage_avg).m_is_cancelled._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this_01->manage_avg).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  (this_01->manage_avg).m_done_count = 0;
  (this_01->manage_avg).m_task_count = 0;
  (this_01->manage_avg).m_callback = (astcenc_progress_callback)0x0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  (this_01->manage_avg).m_callback_min_diff = (float)(int)uVar1;
  (this_01->manage_avg).m_callback_last_value = (float)(int)((ulong)uVar1 >> 0x20);
  (this_01->manage_compress).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->manage_compress).m_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this_01->manage_compress).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this_01->manage_compress).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->manage_compress).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this = &(this_01->manage_compress).m_complete;
  std::condition_variable::condition_variable(this);
  (this_01->manage_compress).m_callback_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this_01->manage_compress).m_callback_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->manage_compress).m_callback_lock.super___mutex_base._M_mutex + 8)
       = 0;
  *(undefined8 *)
   ((long)&(this_01->manage_compress).m_callback_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this_01->manage_compress).m_callback_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->manage_compress).m_init_done = false;
  (this_01->manage_compress).m_term_done = false;
  LOCK();
  (this_01->manage_compress).m_is_cancelled._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this_01->manage_compress).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  (this_01->manage_compress).m_done_count = 0;
  (this_01->manage_compress).m_task_count = 0;
  (this_01->manage_compress).m_callback = (astcenc_progress_callback)0x0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  (this_01->manage_compress).m_callback_min_diff = (float)(int)uVar1;
  (this_01->manage_compress).m_callback_last_value = (float)(int)((ulong)uVar1 >> 0x20);
  (this_01->manage_decompress).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->manage_decompress).m_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this_01->manage_decompress).m_lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this_01->manage_decompress).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->manage_decompress).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this_00 = &(this_01->manage_decompress).m_complete;
  std::condition_variable::condition_variable(this_00);
  (this_01->manage_decompress).m_callback_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this_01->manage_decompress).m_callback_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this_01->manage_decompress).m_callback_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this_01->manage_decompress).m_callback_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this_01->manage_decompress).m_callback_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->manage_decompress).m_init_done = false;
  (this_01->manage_decompress).m_term_done = false;
  LOCK();
  (this_01->manage_decompress).m_is_cancelled._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this_01->manage_decompress).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  (this_01->manage_decompress).m_done_count = 0;
  (this_01->manage_decompress).m_task_count = 0;
  (this_01->manage_decompress).m_callback = (astcenc_progress_callback)0x0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  (this_01->manage_decompress).m_callback_min_diff = (float)(int)uVar1;
  (this_01->manage_decompress).m_callback_last_value = (float)(int)((ulong)uVar1 >> 0x20);
  (this_01->context).thread_count = thread_count;
  uVar34 = configp->flags;
  uVar37 = configp->block_x;
  uVar8 = configp->block_y;
  uVar9 = configp->block_z;
  fVar39 = configp->cw_r_weight;
  fVar6 = configp->cw_g_weight;
  fVar10 = configp->cw_b_weight;
  fVar11 = configp->cw_a_weight;
  uVar12 = configp->a_scale_radius;
  fVar13 = configp->rgbm_m_scale;
  uVar14 = configp->tune_partition_count_limit;
  uVar15 = configp->tune_2partition_index_limit;
  uVar16 = configp->tune_3partition_index_limit;
  uVar17 = configp->tune_4partition_index_limit;
  uVar18 = configp->tune_block_mode_limit;
  uVar19 = configp->tune_refinement_limit;
  uVar20 = configp->tune_candidate_limit;
  uVar21 = configp->tune_2partitioning_candidate_limit;
  uVar22 = configp->tune_3partitioning_candidate_limit;
  uVar23 = configp->tune_4partitioning_candidate_limit;
  fVar24 = configp->tune_db_limit;
  fVar25 = configp->tune_mse_overshoot;
  fVar26 = configp->tune_2partition_early_out_limit_factor;
  fVar27 = configp->tune_mse_overshoot;
  fVar28 = configp->tune_2partition_early_out_limit_factor;
  fVar29 = configp->tune_3partition_early_out_limit_factor;
  fVar30 = configp->tune_2plane_early_out_limit_correlation;
  fVar31 = configp->tune_search_mode0_enable;
  uVar32 = *(undefined4 *)&configp->field_0x6c;
  p_Var7 = configp->progress_callback;
  (this_01->context).config.profile = configp->profile;
  (this_01->context).config.flags = uVar34;
  (this_01->context).config.block_x = uVar37;
  (this_01->context).config.block_y = uVar8;
  (this_01->context).config.block_z = uVar9;
  (this_01->context).config.cw_r_weight = fVar39;
  (this_01->context).config.cw_g_weight = fVar6;
  (this_01->context).config.cw_b_weight = fVar10;
  (this_01->context).config.cw_a_weight = fVar11;
  (this_01->context).config.a_scale_radius = uVar12;
  (this_01->context).config.rgbm_m_scale = fVar13;
  (this_01->context).config.tune_partition_count_limit = uVar14;
  (this_01->context).config.tune_2partition_index_limit = uVar15;
  (this_01->context).config.tune_3partition_index_limit = uVar16;
  (this_01->context).config.tune_4partition_index_limit = uVar17;
  (this_01->context).config.tune_block_mode_limit = uVar18;
  (this_01->context).config.tune_refinement_limit = uVar19;
  (this_01->context).config.tune_candidate_limit = uVar20;
  (this_01->context).config.tune_2partitioning_candidate_limit = uVar21;
  (this_01->context).config.tune_3partitioning_candidate_limit = uVar22;
  (this_01->context).config.tune_4partitioning_candidate_limit = uVar23;
  (this_01->context).config.tune_db_limit = fVar24;
  (this_01->context).config.tune_mse_overshoot = fVar25;
  (this_01->context).config.tune_2partition_early_out_limit_factor = fVar26;
  (this_01->context).config.tune_mse_overshoot = fVar27;
  (this_01->context).config.tune_2partition_early_out_limit_factor = fVar28;
  (this_01->context).config.tune_3partition_early_out_limit_factor = fVar29;
  (this_01->context).config.tune_2plane_early_out_limit_correlation = fVar30;
  (this_01->context).config.tune_search_mode0_enable = fVar31;
  *(undefined4 *)&(this_01->context).config.field_0x6c = uVar32;
  (this_01->context).config.progress_callback = p_Var7;
  (this_01->context).input_alpha_averages = (float *)SUB168(ZEXT816(0) << 0x20,0);
  (this_01->context).working_buffers = (compression_working_buffers *)SUB168(ZEXT816(0) << 0x20,8);
  aVar5 = (this_01->context).config.profile;
  if (ASTCENC_PRF_HDR < aVar5) {
    aVar33 = (uint)(ASTCENC_PRF_HDR < aVar5) * 5;
  }
  else {
    uVar34 = (this_01->context).config.flags;
    aVar33 = ASTCENC_ERR_BAD_FLAGS;
    if ((uVar34 < 0x80) && ((uVar34 & 0x41 & (uVar34 & 0x41) - 1) == 0)) {
      aVar38 = ASTCENC_ERR_BAD_DECODE_MODE;
      if ((uVar34 >> 1 & 1) == 0) {
        aVar38 = ASTCENC_SUCCESS;
      }
      aVar33 = ASTCENC_SUCCESS;
      if (ASTCENC_PRF_LDR < aVar5) {
        aVar33 = aVar38;
      }
    }
    if ((aVar33 == ASTCENC_SUCCESS) &&
       (aVar33 = validate_block_size((this_01->context).config.block_x,
                                     (this_01->context).config.block_y,
                                     (this_01->context).config.block_z), aVar33 == ASTCENC_SUCCESS))
    {
      auVar47 = vmaxss_avx(ZEXT416((uint)(this_01->context).config.rgbm_m_scale),ZEXT416(0x3f800000)
                          );
      (this_01->context).config.rgbm_m_scale = auVar47._0_4_;
      auVar40._8_4_ = 1;
      auVar40._0_8_ = 0x100000001;
      auVar40._12_4_ = 1;
      auVar47._0_4_ = (this_01->context).config.tune_partition_count_limit;
      auVar47._4_4_ = (this_01->context).config.tune_2partition_index_limit;
      auVar47._8_4_ = (this_01->context).config.tune_3partition_index_limit;
      auVar47._12_4_ = (this_01->context).config.tune_4partition_index_limit;
      auVar47 = vpmaxud_avx(auVar40,auVar47);
      auVar47 = vpminud_avx(auVar47,_DAT_0032c660);
      (this_01->context).config.tune_partition_count_limit = auVar47._0_4_;
      (this_01->context).config.tune_2partition_index_limit = auVar47._4_4_;
      (this_01->context).config.tune_3partition_index_limit = auVar47._8_4_;
      (this_01->context).config.tune_4partition_index_limit = auVar47._12_4_;
      uVar34 = (this_01->context).config.tune_block_mode_limit;
      uVar34 = uVar34 + (uVar34 == 0);
      uVar37 = 100;
      if (uVar34 < 100) {
        uVar37 = uVar34;
      }
      (this_01->context).config.tune_block_mode_limit = uVar37;
      uVar34 = (this_01->context).config.tune_refinement_limit;
      (this_01->context).config.tune_refinement_limit = uVar34 + (uVar34 == 0);
      auVar2._0_4_ = (this_01->context).config.tune_candidate_limit;
      auVar2._4_4_ = (this_01->context).config.tune_2partitioning_candidate_limit;
      auVar2._8_4_ = (this_01->context).config.tune_3partitioning_candidate_limit;
      auVar2._12_4_ = (this_01->context).config.tune_4partitioning_candidate_limit;
      auVar47 = vpmaxud_avx(auVar40,auVar2);
      auVar41._8_4_ = 8;
      auVar41._0_8_ = 0x800000008;
      auVar41._12_4_ = 8;
      auVar47 = vpminud_avx(auVar47,auVar41);
      (this_01->context).config.tune_candidate_limit = auVar47._0_4_;
      (this_01->context).config.tune_2partitioning_candidate_limit = auVar47._4_4_;
      (this_01->context).config.tune_3partitioning_candidate_limit = auVar47._8_4_;
      (this_01->context).config.tune_4partitioning_candidate_limit = auVar47._12_4_;
      auVar3._0_4_ = (this_01->context).config.tune_db_limit;
      auVar3._4_4_ = (this_01->context).config.tune_mse_overshoot;
      auVar3._8_4_ = (this_01->context).config.tune_2partition_early_out_limit_factor;
      auVar3._12_4_ = (this_01->context).config.tune_3partition_early_out_limit_factor;
      auVar47 = vmaxps_avx(auVar3,_DAT_0032c670);
      (this_01->context).config.tune_db_limit = (float)auVar47._0_4_;
      (this_01->context).config.tune_mse_overshoot = (float)auVar47._4_4_;
      (this_01->context).config.tune_2partition_early_out_limit_factor = (float)auVar47._8_4_;
      (this_01->context).config.tune_3partition_early_out_limit_factor = (float)auVar47._12_4_;
      auVar47 = vmaxss_avx(ZEXT416((uint)(this_01->context).config.
                                         tune_2plane_early_out_limit_correlation),ZEXT816(0) << 0x40
                          );
      (this_01->context).config.tune_2plane_early_out_limit_correlation = auVar47._0_4_;
      auVar4._0_4_ = (this_01->context).config.cw_r_weight;
      auVar4._4_4_ = (this_01->context).config.cw_g_weight;
      auVar4._8_4_ = (this_01->context).config.cw_b_weight;
      auVar4._12_4_ = (this_01->context).config.cw_a_weight;
      auVar47 = vshufps_avx(auVar4,auVar4,0xe8);
      auVar40 = vshufps_avx(auVar4,auVar4,0xed);
      auVar47 = vmaxps_avx(auVar47,auVar40);
      auVar40 = vmovshdup_avx(auVar47);
      auVar47 = vmaxss_avx(auVar47,auVar40);
      aVar33 = ASTCENC_ERR_BAD_PARAM;
      if (0.0 < auVar47._0_4_) {
        auVar42._0_4_ = auVar47._0_4_ / 1000.0;
        auVar42._4_4_ = auVar42._0_4_;
        auVar42._8_4_ = auVar42._0_4_;
        auVar42._12_4_ = auVar42._0_4_;
        auVar47 = vmaxps_avx(auVar4,auVar42);
        (this_01->context).config.cw_r_weight = (float)auVar47._0_4_;
        (this_01->context).config.cw_g_weight = (float)auVar47._4_4_;
        (this_01->context).config.cw_b_weight = (float)auVar47._8_4_;
        (this_01->context).config.cw_a_weight = (float)auVar47._12_4_;
        aVar33 = ASTCENC_SUCCESS;
      }
    }
  }
  if (aVar33 != ASTCENC_SUCCESS) {
    std::condition_variable::~condition_variable(this_00);
    std::condition_variable::~condition_variable(this);
    std::condition_variable::~condition_variable(local_38);
    operator_delete(this_01,0x2e8);
    return aVar33;
  }
  iVar35 = posix_memalign((void **)&local_48,0x20,0xe27780);
  if (iVar35 == 0) {
    bsd = (block_size_descriptor *)CONCAT44(uStack_44,local_48);
  }
  else {
    bsd = (block_size_descriptor *)0x0;
  }
  (this_01->context).bsd = bsd;
  if (bsd == (block_size_descriptor *)0x0) {
    std::condition_variable::~condition_variable(this_00);
    std::condition_variable::~condition_variable(this);
    std::condition_variable::~condition_variable(local_38);
    operator_delete(this_01,0x2e8);
LAB_002645f8:
    aVar33 = ASTCENC_ERR_OUT_OF_MEM;
  }
  else {
    init_block_size_descriptor
              (configp->block_x,configp->block_y,configp->block_z,
               SUB41((configp->flags & 0x20) >> 5,0),configp->tune_partition_count_limit,
               (float)configp->tune_block_mode_limit / 100.0,bsd);
    if (((this_01->context).config.flags & 0x10) == 0) {
      fVar39 = 0.0;
      if ((this_01->context).config.profile < ASTCENC_PRF_HDR_RGB_LDR_A) {
        fVar39 = (this_01->context).config.tune_db_limit * 0.1;
        fVar6 = fVar39 * -3.3218935;
        auVar43._4_4_ = fVar6;
        auVar43._0_4_ = fVar6;
        auVar43._8_4_ = fVar6;
        auVar43._12_4_ = fVar6;
        auVar44._8_4_ = 0xc2fdffff;
        auVar44._0_8_ = 0xc2fdffffc2fdffff;
        auVar44._12_4_ = 0xc2fdffff;
        auVar47 = vmaxps_avx(auVar43,auVar44);
        auVar45._8_4_ = 0x43010000;
        auVar45._0_8_ = 0x4301000043010000;
        auVar45._12_4_ = 0x43010000;
        auVar40 = vminps_avx(auVar47,auVar45);
        auVar46._0_4_ = (int)(auVar40._0_4_ + -0.5);
        auVar46._4_4_ = (int)(auVar40._4_4_ + -0.5);
        auVar46._8_4_ = (int)(auVar40._8_4_ + -0.5);
        auVar46._12_4_ = (int)(auVar40._12_4_ + -0.5);
        auVar47 = vcvtdq2ps_avx(auVar46);
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        fVar6 = auVar40._0_4_ - auVar47._0_4_;
        auVar47 = vpslld_avx(auVar46,0x17);
        auVar40 = vpaddd_avx(auVar47,auVar49);
        auVar47 = vcmpss_avx(ZEXT416((uint)fVar39),ZEXT816(0) << 0x20,0);
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar47 = vblendvps_avx(ZEXT416((uint)((fVar6 * (fVar6 * (fVar6 * (fVar6 * (fVar6 * 
                                                  0.0018775767 + 0.00898934) + 0.055826318) +
                                                  0.24015361) + 0.6931531) + 0.99999994) *
                                              auVar40._0_4_)),auVar48,auVar47);
        fVar39 = auVar47._0_4_ * 65535.0 * 65535.0;
      }
      (this_01->context).config.tune_db_limit = fVar39;
      iVar35 = posix_memalign((void **)&local_48,0x20,(ulong)thread_count * 0x38940);
      if (iVar35 == 0) {
        pcVar36 = (compression_working_buffers *)CONCAT44(uStack_44,local_48);
      }
      else {
        pcVar36 = (compression_working_buffers *)0x0;
      }
      (this_01->context).working_buffers = pcVar36;
      if (pcVar36 == (compression_working_buffers *)0x0) {
        free((this_01->context).bsd);
        astcenc_context::~astcenc_context(this_01);
        operator_delete(this_01,0x2e8);
        *local_40 = (astcenc_context *)0x0;
        goto LAB_002645f8;
      }
    }
    *local_40 = this_01;
    prepare_angular_tables();
    aVar33 = ASTCENC_SUCCESS;
  }
  return aVar33;
}

Assistant:

static astcenc_error validate_cpu_float()
{
	if32 p;
	volatile float xprec_testval = 2.51f;
	p.f = xprec_testval + 12582912.0f;
	float q = p.f - 12582912.0f;

	if (q != 3.0f)
	{
		return ASTCENC_ERR_BAD_CPU_FLOAT;
	}

	return ASTCENC_SUCCESS;
}